

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O0

void __thiscall sc_core::sc_event_list::add_dynamic(sc_event_list *this,sc_method_handle method_h)

{
  size_type sVar1;
  sc_method_handle in_RDI;
  int i;
  sc_event **l_events;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  *(int *)((long)&(in_RDI->super_sc_process_b).super_sc_object.m_child_events.
                  super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 4) =
       *(int *)((long)&(in_RDI->super_sc_process_b).super_sc_object.m_child_events.
                       super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4) + 1;
  sVar1 = std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::size
                    ((vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>
                      *)in_RDI);
  if (sVar1 != 0) {
    std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::operator[]
              ((vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_> *)
               in_RDI,0);
    sVar1 = std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::size
                      ((vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>
                        *)in_RDI);
    iVar2 = (int)sVar1;
    while (iVar2 = iVar2 + -1, -1 < iVar2) {
      sc_event::add_dynamic((sc_event *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
    }
  }
  return;
}

Assistant:

void
sc_event_list::add_dynamic( sc_method_handle method_h ) const
{
    m_busy++;
    if ( m_events.size() != 0 ) {
      const sc_event* const * l_events = &m_events[0];
      for( int i = m_events.size() - 1; i >= 0; -- i ) {
          l_events[i]->add_dynamic( method_h );
      }
  }
}